

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sr::anon_unknown_0::SparseShaderTextureFunctionCase::createInstance
          (SparseShaderTextureFunctionCase *this,Context *context)

{
  bool bVar1;
  TestInstance *this_00;
  ShaderEvaluator *evaluator;
  UniformSetup *uniformSetup;
  Context *context_local;
  SparseShaderTextureFunctionCase *this_local;
  
  this_00 = (TestInstance *)operator_new(0x228);
  bVar1 = (this->super_ShaderTextureFunctionCase).super_ShaderRenderCase.m_isVertexCase;
  evaluator = de::details::
              UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
              ::operator*(&(this->super_ShaderTextureFunctionCase).super_ShaderRenderCase.
                           m_evaluator.
                           super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
                         );
  uniformSetup = de::details::
                 UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
                 ::operator*(&(this->super_ShaderTextureFunctionCase).super_ShaderRenderCase.
                              m_uniformSetup.
                              super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
                            );
  SparseShaderTextureFunctionInstance::SparseShaderTextureFunctionInstance
            ((SparseShaderTextureFunctionInstance *)this_00,context,(bool)(bVar1 & 1),evaluator,
             uniformSetup,&(this->super_ShaderTextureFunctionCase).m_lookupSpec,
             &(this->super_ShaderTextureFunctionCase).m_textureSpec,
             &(this->super_ShaderTextureFunctionCase).m_lookupParams,IMAGE_BACKING_MODE_SPARSE);
  return this_00;
}

Assistant:

TestInstance* SparseShaderTextureFunctionCase::createInstance (Context& context) const
{
	DE_ASSERT(m_evaluator != DE_NULL);
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new SparseShaderTextureFunctionInstance(context, m_isVertexCase, *m_evaluator, *m_uniformSetup, m_lookupSpec, m_textureSpec, m_lookupParams);
}